

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>
pbrt::PathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_pbrt::PathIntegrator_*,_false> _Var2;
  bool bVar3;
  string lightStrategy;
  Float rrThreshold;
  int maxDepth;
  string local_90;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_70;
  _Head_base<0UL,_pbrt::PathIntegrator_*,_false> local_68;
  SamplerHandle *local_60;
  PrimitiveHandle *local_58;
  bool regularize;
  undefined7 uStack_4f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &lightStrategy.field_2;
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  local_60 = sampler;
  local_58 = aggregate;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&lightStrategy,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"rrthreshold","");
  rrThreshold = ParameterDictionary::GetOneFloat((ParameterDictionary *)camera,&lightStrategy,1.0);
  local_70 = lights;
  local_68._M_head_impl = (PathIntegrator *)parameters;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"lightsampler","");
  _regularize = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&regularize,"bvh","");
  ParameterDictionary::GetOneString
            (&lightStrategy,(ParameterDictionary *)camera,&local_90,(string *)&regularize);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_regularize != &local_40) {
    operator_delete(_regularize,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"regularize","");
  bVar3 = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_68._M_head_impl;
  regularize = bVar3;
  std::
  make_unique<pbrt::PathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,float&,std::__cxx11::string&,bool&>
            ((int *)local_68._M_head_impl,(CameraHandle *)&maxDepth,local_60,local_58,local_70,
             (float *)loc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rrThreshold,
             (bool *)&lightStrategy);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
            )_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<PathIntegrator> PathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    Float rrThreshold = parameters.GetOneFloat("rrthreshold", 1.);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<PathIntegrator>(maxDepth, camera, sampler, aggregate, lights,
                                            rrThreshold, lightStrategy, regularize);
}